

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  uint im;
  uint iM;
  int ni;
  void *pvVar1;
  int *piVar2;
  char *in;
  longlong *hcode;
  HufDec *hdecod;
  long lVar3;
  uchar *b;
  value_type *__val_1;
  bool bVar4;
  value_type_conflict4 *__val;
  char *ptr;
  char *local_40;
  unsigned_short *local_38;
  
  if (nCompressed == 0) {
    bVar4 = false;
  }
  else {
    im = *(uint *)compressed;
    bVar4 = false;
    if ((im < 0x10001) && (iM = *(uint *)(compressed + 4), bVar4 = false, iM < 0x10001)) {
      ni = *(int *)(compressed + 0xc);
      local_40 = compressed + 0x14;
      local_38 = raw;
      hcode = (longlong *)operator_new(0x80008);
      memset(hcode,0,0x80008);
      hdecod = (HufDec *)operator_new(0x40000);
      *(undefined8 *)hdecod = 0;
      hdecod->p = (int *)0x0;
      lVar3 = 0x10;
      do {
        piVar2 = hdecod->p;
        *(undefined8 *)(&hdecod->field_0x0 + lVar3) = *(undefined8 *)hdecod;
        *(int **)((long)(&hdecod->field_0x0 + lVar3) + 8) = piVar2;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x40000);
      lVar3 = 8;
      do {
        *(undefined4 *)((long)hdecod + lVar3 + -8) = 0;
        *(undefined8 *)(&hdecod->field_0x0 + lVar3) = 0;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x40008);
      hufUnpackEncTable(&local_40,nCompressed + -0x14,im,iM,hcode);
      in = local_40;
      bVar4 = (long)ni <= (long)(compressed + ((long)nCompressed - (long)local_40)) * 8;
      if ((long)ni <= (long)(compressed + ((long)nCompressed - (long)local_40)) * 8) {
        hufBuildDecTable(hcode,im,iM,hdecod);
        hufDecode(hcode,hdecod,in,ni,iM,nRaw,local_38);
        lVar3 = 0;
        do {
          pvVar1 = *(void **)((long)&hdecod->p + lVar3);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
            *(undefined8 *)((long)&hdecod->p + lVar3) = 0;
          }
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x40000);
      }
      operator_delete(hdecod,0x40000);
      operator_delete(hcode,0x80008);
    }
  }
  return bVar4;
}

Assistant:

bool hufUncompress(const char compressed[], int nCompressed,
                   unsigned short raw[], int nRaw) {
  if (nCompressed == 0) {
    if (nRaw != 0) return false;

    return false;
  }

  int im = readUInt(compressed);
  int iM = readUInt(compressed + 4);
  // int tableLength = readUInt (compressed + 8);
  int nBits = readUInt(compressed + 12);

  if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE) return false;

  const char *ptr = compressed + 20;

  //
  // Fast decoder needs at least 2x64-bits of compressed data, and
  // needs to be run-able on this platform. Otherwise, fall back
  // to the original decoder
  //

  // if (FastHufDecoder::enabled() && nBits > 128)
  //{
  //    FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);
  //    fhd.decode ((unsigned char*)ptr, nBits, raw, nRaw);
  //}
  // else
  {
    std::vector<long long> freq(HUF_ENCSIZE);
    std::vector<HufDec> hdec(HUF_DECSIZE);

    hufClearDecTable(&hdec.at(0));

    hufUnpackEncTable(&ptr, nCompressed - (ptr - compressed), im, iM,
                      &freq.at(0));

    {
      if (nBits > 8 * (nCompressed - (ptr - compressed))) {
        return false;
      }

      hufBuildDecTable(&freq.at(0), im, iM, &hdec.at(0));
      hufDecode(&freq.at(0), &hdec.at(0), ptr, nBits, iM, nRaw, raw);
    }
    // catch (...)
    //{
    //    hufFreeDecTable (hdec);
    //    throw;
    //}

    hufFreeDecTable(&hdec.at(0));
  }

  return true;
}